

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,char *message)

{
  size_t sVar1;
  char *__s;
  string local_50;
  
  __s = "(null)";
  if (message != (char *)0x0) {
    __s = message;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar1);
  PushTrace(this,file,line,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const char* message) {
    PushTrace(file, line, message ? message : "(null)");
  }